

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O2

BBox<3> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
          (BBox<3> *__return_storage_ptr__,int param_2,int first,Write<signed_char> *param_4,
          undefined8 param_5,undefined8 param_6,double init,double param_8,double param_9,
          double param_10,double param_11,double param_12)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  type transform_local;
  BBox<3> c;
  double local_108 [6];
  double local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  double local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  Write<signed_char> local_a8;
  double local_98 [7];
  double local_60 [6];
  
  entering_parallel = 1;
  Write<double>::Write(&local_a8,param_4);
  entering_parallel = 0;
  lVar4 = (long)param_2;
  local_a8.shared_alloc_.direct_ptr =
       (void *)(lVar4 * 0x18 + (long)local_a8.shared_alloc_.direct_ptr);
  for (; lVar4 != first; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      local_108[lVar5] = *(double *)((long)local_a8.shared_alloc_.direct_ptr + lVar5 * 8);
    }
    local_b0 = local_108[2];
    local_c0 = local_108[0];
    uStack_b8 = local_108[1];
    local_c8 = local_108[2];
    local_d8 = local_108[0];
    uStack_d0 = local_108[1];
    local_108[4] = local_108[1];
    local_108[5] = local_108[2];
    local_108[3] = local_108[0];
    local_98[4] = param_11;
    local_98[5] = param_12;
    local_98[2] = param_9;
    local_98[3] = param_10;
    local_98[0] = init;
    local_98[1] = param_8;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      dVar1 = local_108[lVar5];
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = local_108[lVar5 + 3];
      uVar8 = SUB84(dVar2,0);
      uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
      dVar3 = local_98[lVar5];
      if (dVar3 <= dVar1) {
        uVar6 = SUB84(dVar3,0);
        uVar7 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      local_60[lVar5] = (double)CONCAT44(uVar7,uVar6);
      dVar1 = local_98[lVar5 + 3];
      if (dVar2 <= dVar1) {
        uVar8 = SUB84(dVar1,0);
        uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      local_60[lVar5 + 3] = (double)CONCAT44(uVar9,uVar8);
    }
    init = local_60[0];
    param_8 = local_60[1];
    param_9 = local_60[2];
    param_10 = local_60[3];
    param_11 = local_60[4];
    param_12 = local_60[5];
    local_a8.shared_alloc_.direct_ptr = (void *)((long)local_a8.shared_alloc_.direct_ptr + 0x18);
  }
  (__return_storage_ptr__->max).super_Few<double,_3>.array_[1] = param_11;
  (__return_storage_ptr__->max).super_Few<double,_3>.array_[2] = param_12;
  (__return_storage_ptr__->min).super_Few<double,_3>.array_[2] = param_9;
  (__return_storage_ptr__->max).super_Few<double,_3>.array_[0] = param_10;
  (__return_storage_ptr__->min).super_Few<double,_3>.array_[0] = init;
  (__return_storage_ptr__->min).super_Few<double,_3>.array_[1] = param_8;
  Write<double>::~Write((Write<double> *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}